

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O2

set<int,_std::less<int>,_std::allocator<int>_> *
queryfromhashmap(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
                vector<int,_std::allocator<int>_> *qu,int offset,int d,int treeid)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_const_iterator<int> _Var2;
  int iVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  int i;
  long lVar6;
  long lVar7;
  map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this;
  point f;
  key_type local_58;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  iVar3 = PAA_DIMENSION[d];
  lVar6 = (long)offset << 2;
  local_58.d = iVar3;
  for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&local_58.f,
               (value_type_conflict1 *)
               ((long)(qu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar6));
    iVar3 = PAA_DIMENSION[d];
    lVar6 = lVar6 + 4;
  }
  this = tree[d] + treeid;
  sVar4 = std::
          map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::count(this,&local_58);
  if (sVar4 != 0) {
    pmVar5 = std::
             map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](this,&local_58);
    _Var2._M_node = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar5 = std::
             map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](this,&local_58);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               __return_storage_ptr__,_Var2,
               (_Rb_tree_const_iterator<int>)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header);
  }
  for (lVar6 = 0; lVar6 < PAA_DIMENSION[d]; lVar6 = lVar6 + 1) {
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar6] =
         local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar6] + -1;
    sVar4 = std::
            map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::count(this,&local_58);
    if (sVar4 != 0) {
      pmVar5 = std::
               map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](this,&local_58);
      _Var2._M_node = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar5 = std::
               map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](this,&local_58);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 __return_storage_ptr__,_Var2,
                 (_Rb_tree_const_iterator<int>)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header);
    }
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar6] =
         local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar6] + 2;
    sVar4 = std::
            map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::count(this,&local_58);
    if (sVar4 != 0) {
      pmVar5 = std::
               map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](this,&local_58);
      _Var2._M_node = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar5 = std::
               map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](this,&local_58);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 __return_storage_ptr__,_Var2,
                 (_Rb_tree_const_iterator<int>)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header);
    }
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar6] =
         local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar6] + -1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

set<int> queryfromhashmap(vector<int> &qu, int offset, int d, int treeid) {
    set<int> cnt;
    point f;
    f.d = PAA_DIMENSION[d];
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f.push_back(qu[offset + i]);
    }
    if (tree[d][treeid].count(f)) {
        cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
    }
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f[i] -= 1;
        if (tree[d][treeid].count(f)) {
            cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
        }
        f.f[i] += 2;
        if (tree[d][treeid].count(f)) {
            cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
        }
        f.f[i] -= 1;
    }
    return cnt;
}